

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  char *__s;
  byte bVar1;
  TargetType TVar2;
  const_reference pvVar3;
  cmGeneratorTarget *this_00;
  ostream *poVar4;
  cmMakefile *this_01;
  reference objFile;
  bool bVar5;
  string *o_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmMakefile *mf;
  reference local_698;
  string *o;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_658 [8];
  string obj_dir;
  string local_630;
  undefined1 local_610 [8];
  string suffix;
  char *imp;
  char *loc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string local_5a8;
  undefined1 local_588 [8];
  ostringstream e_2;
  string local_410 [8];
  string reason;
  cmGlobalGenerator *gg;
  string local_3c8;
  undefined1 local_3a8 [8];
  ostringstream e_1;
  TargetType type;
  string local_208;
  undefined1 local_1e8 [8];
  ostringstream e;
  cmGeneratorTarget *gt;
  string tgtName;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetObjectsNode *this_local;
  
  tgtName.field_2._8_8_ = param_4;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(parameters);
  std::__cxx11::string::string((string *)&gt,(string *)pvVar3);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,(string *)&gt);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    poVar4 = std::operator<<((ostream *)local_1e8,"Objects of target \"");
    poVar4 = std::operator<<(poVar4,(string *)&gt);
    std::operator<<(poVar4,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_208,content);
    std::__cxx11::ostringstream::str();
    reportError(context,&local_208,(string *)&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if ((((TVar2 == EXECUTABLE) || (TVar2 == STATIC_LIBRARY)) || (TVar2 == SHARED_LIBRARY)) ||
       ((TVar2 == MODULE_LIBRARY || (TVar2 == OBJECT_LIBRARY)))) {
      if ((context->EvaluateForBuildsystem & 1U) == 0) {
        reason.field_2._8_8_ = cmLocalGenerator::GetGlobalGenerator(context->LG);
        std::__cxx11::string::string(local_410);
        bVar1 = (**(code **)(*(long *)reason.field_2._8_8_ + 0x128))(reason.field_2._8_8_,local_410)
        ;
        bVar5 = (bVar1 & 1) == 0;
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
          poVar4 = std::operator<<((ostream *)local_588,
                                   "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake (limited"
                                  );
          poVar4 = std::operator<<(poVar4,local_410);
          std::operator<<(poVar4,").  It is not suitable for writing out elsewhere.");
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_5a8,content);
          std::__cxx11::ostringstream::str();
          reportError(context,&local_5a8,
                      (string *)
                      &objects.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &objects.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
        }
        std::__cxx11::string::~string(local_410);
        if (bVar5) goto LAB_005e45c3;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&loc);
      bVar5 = cmGeneratorTarget::IsImported(this_00);
      if (bVar5) {
        imp = (char *)0x0;
        suffix.field_2._8_8_ = 0;
        std::__cxx11::string::string((string *)local_610);
        bVar5 = cmTarget::GetMappedConfig
                          (this_00->Target,&context->Config,&imp,
                           (char **)((long)&suffix.field_2 + 8),(string *)local_610);
        __s = imp;
        if (bVar5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_630,__s,
                     (allocator<char> *)(obj_dir.field_2._M_local_buf + 0xf));
          cmSystemTools::ExpandListArgument
                    (&local_630,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&loc,false);
          std::__cxx11::string::~string((string *)&local_630);
          std::allocator<char>::~allocator((allocator<char> *)(obj_dir.field_2._M_local_buf + 0xf));
        }
        context->HadContextSensitiveCondition = true;
        std::__cxx11::string::~string((string *)local_610);
      }
      else {
        cmGeneratorTarget::GetTargetObjectNames
                  (this_00,&context->Config,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&loc);
        std::__cxx11::string::string((string *)local_658);
        if ((context->EvaluateForBuildsystem & 1U) == 0) {
          cmGeneratorTarget::GetObjectDirectory((string *)&__range2,this_00,&context->Config);
          std::__cxx11::string::operator=((string *)local_658,(string *)&__range2);
          std::__cxx11::string::~string((string *)&__range2);
          context->HadContextSensitiveCondition = true;
        }
        else {
          std::__cxx11::string::operator=((string *)local_658,(string *)&this_00->ObjectDirectory);
        }
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&loc);
        o = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&loc);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&o), bVar5) {
          local_698 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mf,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_658,local_698);
          std::__cxx11::string::operator=((string *)local_698,(string *)&mf);
          std::__cxx11::string::~string((string *)&mf);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        std::__cxx11::string::~string((string *)local_658);
      }
      this_01 = cmLocalGenerator::GetMakefile(context->LG);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&loc);
      o_1 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&loc);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&o_1), bVar5) {
        objFile = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
        cmMakefile::AddTargetObject(this_01,(string *)&gt,objFile);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&loc,";");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&loc);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      poVar4 = std::operator<<((ostream *)local_3a8,"Objects of target \"");
      poVar4 = std::operator<<(poVar4,(string *)&gt);
      poVar4 = std::operator<<(poVar4,
                               "\" referenced but is not an allowed library types (EXECUTABLE, ");
      std::operator<<(poVar4,"STATIC, SHARED, MODULE, OBJECT).");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3c8,content);
      std::__cxx11::ostringstream::str();
      reportError(context,&local_3c8,(string *)&gg);
      std::__cxx11::string::~string((string *)&gg);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
    }
  }
LAB_005e45c3:
  std::__cxx11::string::~string((string *)&gt);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::STATIC_LIBRARY &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY &&
        type != cmStateEnums::OBJECT_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not an allowed library types (EXECUTABLE, "
        << "STATIC, SHARED, MODULE, OBJECT).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    if (!context->EvaluateForBuildsystem) {
      cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
      std::string reason;
      if (!gg->HasKnownObjectFileLocation(&reason)) {
        std::ostringstream e;
        e << "The evaluation of the TARGET_OBJECTS generator expression "
             "is only suitable for consumption by CMake (limited"
          << reason
          << ").  "
             "It is not suitable for writing out elsewhere.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }

    std::vector<std::string> objects;

    if (gt->IsImported()) {
      const char* loc = nullptr;
      const char* imp = nullptr;
      std::string suffix;
      if (gt->Target->GetMappedConfig(context->Config, &loc, &imp, suffix)) {
        cmSystemTools::ExpandListArgument(loc, objects);
      }
      context->HadContextSensitiveCondition = true;
    } else {
      gt->GetTargetObjectNames(context->Config, objects);

      std::string obj_dir;
      if (context->EvaluateForBuildsystem) {
        // Use object file directory with buildsystem placeholder.
        obj_dir = gt->ObjectDirectory;
        // Here we assume that the set of object files produced
        // by an object library does not vary with configuration
        // and do not set HadContextSensitiveCondition to true.
      } else {
        // Use object file directory with per-config location.
        obj_dir = gt->GetObjectDirectory(context->Config);
        context->HadContextSensitiveCondition = true;
      }

      for (std::string& o : objects) {
        o = obj_dir + o;
      }
    }

    // Create the cmSourceFile instances in the referencing directory.
    cmMakefile* mf = context->LG->GetMakefile();
    for (std::string& o : objects) {
      mf->AddTargetObject(tgtName, o);
    }

    return cmJoin(objects, ";");
  }